

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,Module *wasm,PassOptions *options)

{
  *(code **)this = ::wasm::Module::removeFunction;
  *(Module **)(this + 8) = wasm;
  *(MixedArena **)(this + 0x10) = &wasm->allocator;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  PassOptions::PassOptions((PassOptions *)(this + 0x30),options);
  *(undefined2 *)(this + 0xe8) = 0;
  return;
}

Assistant:

PassRunner(Module* wasm, PassOptions options)
    : wasm(wasm), allocator(&wasm->allocator), options(options) {}